

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O1

void __thiscall KDReports::Test::testTextId(Test *this)

{
  QStringView QVar1;
  QStringView QVar2;
  QStringView QVar3;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  longlong __tmp;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  char *local_70;
  QStringView local_68;
  Report report;
  QFile file;
  
  local_88.d = (Data *)0x110605;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_b8,(char **)&local_88)
  ;
  QVar10.m_data = (storage_type *)local_b8.d;
  QVar10.m_size = (qsizetype)&local_a0;
  QString::fromUtf8(QVar10);
  _report = local_a0.d;
  local_a0.d = (Data *)0x0;
  local_a0.ptr = (char16_t *)0x0;
  local_a0.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QFile::QFile(&file,(QString *)&report);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
  bVar7 = (bool)QFile::open(&file,1);
  cVar8 = QTest::qVerify(bVar7,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x2c);
  if (cVar8 != '\0') {
    KDReports::Report::Report(&report,(QObject *)0x0);
    local_68.m_size = 0x1108f2;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)&local_88,(char **)&local_68);
    QVar11.m_data = (storage_type *)local_88.d;
    QVar11.m_size = (qsizetype)&local_a0;
    QString::fromUtf8(QVar11);
    local_b8.d = local_a0.d;
    local_b8.ptr = local_a0.ptr;
    local_a0.d = (Data *)0x0;
    local_a0.ptr = (char16_t *)0x0;
    local_b8.size = local_a0.size;
    local_a0.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    local_70 = "Ti";
    QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_68,&local_70);
    QVar12.m_data = (storage_type *)local_68.m_size;
    QVar12.m_size = (qsizetype)&local_a0;
    QString::fromUtf8(QVar12);
    local_88.d = local_a0.d;
    local_88.ptr = local_a0.ptr;
    local_a0.d = (Data *)0x0;
    local_a0.ptr = (char16_t *)0x0;
    local_88.size = local_a0.size;
    local_a0.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    local_68.m_size = 0x111629;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)&local_88,(char **)&local_68);
    QVar13.m_data = (storage_type *)local_88.d;
    QVar13.m_size = (qsizetype)&local_a0;
    QString::fromUtf8(QVar13);
    local_b8.d = local_a0.d;
    local_b8.ptr = local_a0.ptr;
    local_a0.d = (Data *)0x0;
    local_a0.ptr = (char16_t *)0x0;
    local_b8.size = local_a0.size;
    local_a0.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    local_70 = "tle";
    QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_68,&local_70);
    QVar14.m_data = (storage_type *)local_68.m_size;
    QVar14.m_size = (qsizetype)&local_a0;
    QString::fromUtf8(QVar14);
    local_88.d = local_a0.d;
    local_88.ptr = local_a0.ptr;
    local_a0.d = (Data *)0x0;
    local_a0.ptr = (char16_t *)0x0;
    local_88.size = local_a0.size;
    local_a0.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    local_68.m_size = 0x110616;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)&local_88,(char **)&local_68);
    QVar15.m_data = (storage_type *)local_88.d;
    QVar15.m_size = (qsizetype)&local_a0;
    QString::fromUtf8(QVar15);
    local_b8.d = local_a0.d;
    local_b8.ptr = local_a0.ptr;
    local_a0.d = (Data *)0x0;
    local_a0.ptr = (char16_t *)0x0;
    local_b8.size = local_a0.size;
    local_a0.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    local_70 = "textid.xml";
    QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_68,&local_70);
    QVar16.m_data = (storage_type *)local_68.m_size;
    QVar16.m_size = (qsizetype)&local_a0;
    QString::fromUtf8(QVar16);
    local_88.d = local_a0.d;
    local_88.ptr = local_a0.ptr;
    local_a0.d = (Data *)0x0;
    local_a0.ptr = (char16_t *)0x0;
    local_88.size = local_a0.size;
    local_a0.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    bVar7 = (bool)KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar8 = QTest::qVerify(bVar7,"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x31);
    if (cVar8 != '\0') {
      KDReports::Report::mainTextDocument();
      iVar9 = QTextDocument::blockCount();
      cVar8 = QTest::qCompare(iVar9,4,"report.mainTextDocument()->blockCount()","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0x32);
      if (cVar8 != '\0') {
        KDReports::Report::mainTextDocument();
        QTextDocument::toPlainText();
        local_70 = "Title .\ntextid.xml\n\n";
        QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_68,&local_70);
        QVar17.m_data = (storage_type *)local_68.m_size;
        QVar17.m_size = (qsizetype)&local_a0;
        QString::fromUtf8(QVar17);
        local_88.d = local_a0.d;
        local_88.ptr = local_a0.ptr;
        local_a0.d = (Data *)0x0;
        local_a0.ptr = (char16_t *)0x0;
        local_88.size = local_a0.size;
        local_a0.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
        QStringView::QStringView<QChar,_true>
                  ((QStringView *)&local_a0,(QChar *)local_b8.ptr,local_b8.size);
        QStringView::QStringView<QChar,_true>(&local_68,(QChar *)local_88.ptr,local_88.size);
        QVar1.m_data = local_a0.ptr;
        QVar1.m_size = (qsizetype)local_a0.d;
        QVar4.m_data = local_68.m_data;
        QVar4.m_size = local_68.m_size;
        cVar8 = QTest::qCompare(QVar1,QVar4,"report.mainTextDocument()->toPlainText()",
                                "QString(\"Title .\\ntextid.xml\\n\\n\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0x33);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        if (cVar8 != '\0') {
          local_68.m_size = 0x1108f2;
          QByteArrayView::QByteArrayView<const_char_*,_true>
                    ((QByteArrayView *)&local_88,(char **)&local_68);
          QVar18.m_data = (storage_type *)local_88.d;
          QVar18.m_size = (qsizetype)&local_a0;
          QString::fromUtf8(QVar18);
          local_b8.d = local_a0.d;
          local_b8.ptr = local_a0.ptr;
          local_a0.d = (Data *)0x0;
          local_a0.ptr = (char16_t *)0x0;
          local_b8.size = local_a0.size;
          local_a0.size = 0;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
          local_70 = "New Ti";
          QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_68,&local_70);
          QVar19.m_data = (storage_type *)local_68.m_size;
          QVar19.m_size = (qsizetype)&local_a0;
          QString::fromUtf8(QVar19);
          local_88.d = local_a0.d;
          local_88.ptr = local_a0.ptr;
          local_a0.d = (Data *)0x0;
          local_a0.ptr = (char16_t *)0x0;
          local_88.size = local_a0.size;
          local_a0.size = 0;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
          KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          KDReports::Report::mainTextDocument();
          QTextDocument::toPlainText();
          local_70 = "New Title .\ntextid.xml\n\n";
          QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_68,&local_70);
          QVar20.m_data = (storage_type *)local_68.m_size;
          QVar20.m_size = (qsizetype)&local_a0;
          QString::fromUtf8(QVar20);
          local_88.d = local_a0.d;
          local_88.ptr = local_a0.ptr;
          local_a0.d = (Data *)0x0;
          local_a0.ptr = (char16_t *)0x0;
          local_88.size = local_a0.size;
          local_a0.size = 0;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
          QStringView::QStringView<QChar,_true>
                    ((QStringView *)&local_a0,(QChar *)local_b8.ptr,local_b8.size);
          QStringView::QStringView<QChar,_true>(&local_68,(QChar *)local_88.ptr,local_88.size);
          QVar2.m_data = local_a0.ptr;
          QVar2.m_size = (qsizetype)local_a0.d;
          QVar5.m_data = local_68.m_data;
          QVar5.m_size = local_68.m_size;
          cVar8 = QTest::qCompare(QVar2,QVar5,"report.mainTextDocument()->toPlainText()",
                                  "QString(\"New Title .\\ntextid.xml\\n\\n\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0x37);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          if (cVar8 != '\0') {
            local_68.m_size = 0x110616;
            QByteArrayView::QByteArrayView<const_char_*,_true>
                      ((QByteArrayView *)&local_88,(char **)&local_68);
            QVar21.m_data = (storage_type *)local_88.d;
            QVar21.m_size = (qsizetype)&local_a0;
            QString::fromUtf8(QVar21);
            local_b8.d = local_a0.d;
            local_b8.ptr = local_a0.ptr;
            local_a0.d = (Data *)0x0;
            local_a0.ptr = (char16_t *)0x0;
            local_b8.size = local_a0.size;
            local_a0.size = 0;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
            local_70 = "changed";
            QByteArrayView::QByteArrayView<const_char_*,_true>
                      ((QByteArrayView *)&local_68,&local_70);
            QVar22.m_data = (storage_type *)local_68.m_size;
            QVar22.m_size = (qsizetype)&local_a0;
            QString::fromUtf8(QVar22);
            local_88.d = local_a0.d;
            local_88.ptr = local_a0.ptr;
            local_a0.d = (Data *)0x0;
            local_a0.ptr = (char16_t *)0x0;
            local_88.size = local_a0.size;
            local_a0.size = 0;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
            KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_b8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
            KDReports::Report::mainTextDocument();
            QTextDocument::toPlainText();
            local_70 = "New Title .\nchanged\n\n";
            QByteArrayView::QByteArrayView<const_char_*,_true>
                      ((QByteArrayView *)&local_68,&local_70);
            QVar23.m_data = (storage_type *)local_68.m_size;
            QVar23.m_size = (qsizetype)&local_a0;
            QString::fromUtf8(QVar23);
            local_88.d = local_a0.d;
            local_88.ptr = local_a0.ptr;
            local_a0.d = (Data *)0x0;
            local_a0.ptr = (char16_t *)0x0;
            local_88.size = local_a0.size;
            local_a0.size = 0;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
            QStringView::QStringView<QChar,_true>
                      ((QStringView *)&local_a0,(QChar *)local_b8.ptr,local_b8.size);
            QStringView::QStringView<QChar,_true>(&local_68,(QChar *)local_88.ptr,local_88.size);
            QVar3.m_data = local_a0.ptr;
            QVar3.m_size = (qsizetype)local_a0.d;
            QVar6.m_data = local_68.m_data;
            QVar6.m_size = local_68.m_size;
            cVar8 = QTest::qCompare(QVar3,QVar6,"report.mainTextDocument()->toPlainText()",
                                    "QString(\"New Title .\\nchanged\\n\\n\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                    ,0x3a);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
            if (cVar8 != '\0') {
              QString::QString((QString *)&local_a0,"1");
              QString::QString((QString *)&local_b8,"Newer Ti");
              KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_a0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
              KDReports::Report::mainTextDocument();
              QTextDocument::toPlainText();
              QString::QString((QString *)&local_b8,"Newer Title .\nchanged\n\n");
              bVar7 = QTest::qCompare((QString *)&local_a0,(QString *)&local_b8,
                                      "report.mainTextDocument()->toPlainText()",
                                      "QString(\"Newer Title .\\nchanged\\n\\n\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                      ,0x3c);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
              if (bVar7) {
                QString::QString((QString *)&local_a0,"5");
                QString::QString((QString *)&local_b8,"well");
                KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_a0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
                KDReports::Report::mainTextDocument();
                QTextDocument::toPlainText();
                QString::QString((QString *)&local_b8,"Newer Title .\nchanged\n\nwell");
                bVar7 = QTest::qCompare((QString *)&local_a0,(QString *)&local_b8,
                                        "report.mainTextDocument()->toPlainText()",
                                        "QString(\"Newer Title .\\nchanged\\n\\nwell\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                        ,0x3f);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
                if (bVar7) {
                  QString::QString((QString *)&local_a0,"4");
                  QString::QString((QString *)&local_b8,"works");
                  KDReports::Report::associateTextValue((QString *)&report,(QString *)&local_a0);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
                  KDReports::Report::mainTextDocument();
                  QTextDocument::toPlainText();
                  QString::QString((QString *)&local_b8,"Newer Title .\nchanged\nworks\nwell");
                  QTest::qCompare((QString *)&local_a0,(QString *)&local_b8,
                                  "report.mainTextDocument()->toPlainText()",
                                  "QString(\"Newer Title .\\nchanged\\nworks\\nwell\")",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0x42);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
                }
              }
            }
          }
        }
      }
    }
    KDReports::Report::~Report(&report);
  }
  QFile::~QFile(&file);
  return;
}

Assistant:

void testTextId()
    {
        QFile file(":/textid.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        report.associateTextValue("1", "Ti");
        report.associateTextValue("2", "tle");
        report.associateTextValue("3", "textid.xml");
        QVERIFY(report.loadFromXML(&file));
        QCOMPARE(report.mainTextDocument()->blockCount(), 4);
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("Title .\ntextid.xml\n\n"));

        // Now test changing text values -after- loading.
        report.associateTextValue("1", "New Ti");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("New Title .\ntextid.xml\n\n"));

        report.associateTextValue("3", "changed");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("New Title .\nchanged\n\n"));
        report.associateTextValue("1", "Newer Ti");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("Newer Title .\nchanged\n\n"));

        report.associateTextValue("5", "well");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("Newer Title .\nchanged\n\nwell"));

        report.associateTextValue("4", "works");
        QCOMPARE(report.mainTextDocument()->toPlainText(), QString("Newer Title .\nchanged\nworks\nwell"));
    }